

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::DvpValidateCommittedShaderResources
          (DeviceContextVkImpl *this,ResourceBindInfo *BindInfo)

{
  Uint32 UVar1;
  PipelineStateVkImpl *pPVar2;
  Char *pCVar3;
  reference this_00;
  const_reference ppVVar4;
  PipelineResourceSignatureDesc *Args_2;
  string *in_stack_ffffffffffffff08;
  undefined1 local_c8 [8];
  string msg_2;
  string msg_1;
  Uint32 s;
  Uint32 DSCount;
  DescriptorSetInfo *SetInfo;
  string msg;
  PipelineResourceSignatureVkImpl *pSign;
  uint local_48;
  Uint32 i;
  Uint32 SignCount;
  function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)> local_38;
  ResourceBindInfo *local_18;
  ResourceBindInfo *BindInfo_local;
  DeviceContextVkImpl *this_local;
  
  if (((BindInfo->super_CommittedShaderResources).ResourcesValidated & 1U) == 0) {
    local_18 = BindInfo;
    BindInfo_local = (ResourceBindInfo *)this;
    std::function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)>::function
              (&local_38,(nullptr_t)0x0);
    DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifySRBCompatibility
              ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,
               &BindInfo->super_CommittedShaderResources,&local_38);
    std::function<Diligent::PipelineResourceSignatureVkImpl_*(unsigned_int)>::~function(&local_38);
    pPVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    local_48 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignatureCount
                         (&pPVar2->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    for (pSign._4_4_ = 0; pSign._4_4_ < local_48; pSign._4_4_ = pSign._4_4_ + 1) {
      pPVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                         (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
      msg.field_2._8_8_ =
           PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
                     (&pPVar2->super_PipelineStateBase<Diligent::EngineVkImplTraits>,pSign._4_4_);
      if (((PipelineResourceSignatureImplType *)msg.field_2._8_8_ !=
           (PipelineResourceSignatureImplType *)0x0) &&
         (UVar1 = PipelineResourceSignatureVkImpl::GetNumDescriptorSets
                            ((PipelineResourceSignatureVkImpl *)msg.field_2._8_8_), UVar1 != 0)) {
        if (((local_18->super_CommittedShaderResources).StaleSRBMask &
            (local_18->super_CommittedShaderResources).ActiveSRBMask) != 0) {
          FormatString<char[57]>
                    ((string *)&SetInfo,
                     (char (*) [57])"CommitDescriptorSets() must be called before validation.");
          pCVar3 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar3,"DvpValidateCommittedShaderResources",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,499);
          std::__cxx11::string::~string((string *)&SetInfo);
        }
        this_00 = std::
                  array<Diligent::DeviceContextVkImpl::ResourceBindInfo::DescriptorSetInfo,_8UL>::
                  operator[](&local_18->SetInfo,(ulong)pSign._4_4_);
        msg_1.field_2._12_4_ =
             PipelineResourceSignatureVkImpl::GetNumDescriptorSets
                       ((PipelineResourceSignatureVkImpl *)msg.field_2._8_8_);
        for (msg_1.field_2._8_4_ = 0; (uint)msg_1.field_2._8_4_ < (uint)msg_1.field_2._12_4_;
            msg_1.field_2._8_4_ = msg_1.field_2._8_4_ + 1) {
          ppVVar4 = std::array<VkDescriptorSet_T_*,_2UL>::operator[]
                              (&this_00->vkSets,(ulong)(uint)msg_1.field_2._8_4_);
          if (*ppVVar4 == (value_type)0x0) {
            Args_2 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                     ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                *)msg.field_2._8_8_);
            FormatString<char[27],unsigned_int,char[39],char_const*,char[18],unsigned_int,char[2]>
                      ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"descriptor set with index "
                       ,(char (*) [27])((long)&msg_1.field_2 + 8),
                       (uint *)" is not bound for resource signature \'",(char (*) [39])Args_2,
                       (char **)"\', binding index ",(char (*) [18])((long)&pSign + 4),
                       (uint *)0xcca6b6,(char (*) [2])in_stack_ffffffffffffff08);
            pCVar3 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar3,"DvpValidateCommittedShaderResources",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0x1fb);
            std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
          }
        }
        if (this_00->LastBoundBaseInd != this_00->BaseInd) {
          in_stack_ffffffffffffff08 = (string *)local_c8;
          FormatString<char[34],unsigned_int,char[33],unsigned_int,char[56],unsigned_int,char[77]>
                    (in_stack_ffffffffffffff08,(Diligent *)"Shader resource binding at index ",
                     (char (*) [34])((long)&pSign + 4),(uint *)" has descriptor set base offset ",
                     (char (*) [33])&this_00->BaseInd,
                     (uint *)", but currently bound descriptor sets have base offset ",
                     (char (*) [56])&this_00->LastBoundBaseInd,
                     (uint *)
                     "; one of the resource signatures with lower binding index is not compatible.",
                     (char (*) [77])in_stack_ffffffffffffff08);
          pCVar3 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar3,"DvpValidateCommittedShaderResources",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x201);
          std::__cxx11::string::~string((string *)local_c8);
        }
      }
    }
    pPVar2 = RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState);
    PipelineStateVkImpl::DvpVerifySRBResources(pPVar2,this,(ShaderResourceCacheArrayType *)local_18)
    ;
    (local_18->super_CommittedShaderResources).ResourcesValidated = true;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::DvpValidateCommittedShaderResources(ResourceBindInfo& BindInfo)
{
    if (BindInfo.ResourcesValidated)
        return;

    DvpVerifySRBCompatibility(BindInfo);

    const Uint32 SignCount = m_pPipelineState->GetResourceSignatureCount();
    for (Uint32 i = 0; i < SignCount; ++i)
    {
        const PipelineResourceSignatureVkImpl* pSign = m_pPipelineState->GetResourceSignature(i);
        if (pSign == nullptr || pSign->GetNumDescriptorSets() == 0)
            continue; // Skip null and empty signatures

        DEV_CHECK_ERR((BindInfo.StaleSRBMask & BindInfo.ActiveSRBMask) == 0, "CommitDescriptorSets() must be called before validation.");

        const ResourceBindInfo::DescriptorSetInfo& SetInfo = BindInfo.SetInfo[i];
        const Uint32                               DSCount = pSign->GetNumDescriptorSets();
        for (Uint32 s = 0; s < DSCount; ++s)
        {
            DEV_CHECK_ERR(SetInfo.vkSets[s] != VK_NULL_HANDLE,
                          "descriptor set with index ", s, " is not bound for resource signature '",
                          pSign->GetDesc().Name, "', binding index ", i, ".");
        }

        DEV_CHECK_ERR(SetInfo.LastBoundBaseInd == SetInfo.BaseInd,
                      "Shader resource binding at index ", i, " has descriptor set base offset ", SetInfo.BaseInd,
                      ", but currently bound descriptor sets have base offset ", SetInfo.LastBoundBaseInd,
                      "; one of the resource signatures with lower binding index is not compatible.");
    }

    m_pPipelineState->DvpVerifySRBResources(this, BindInfo.ResourceCaches);

    BindInfo.ResourcesValidated = true;
}